

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_rawset(lua_State *L,int idx)

{
  StkId pTVar1;
  undefined4 uVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  TValue *slot;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  pTVar3 = index2addr(L,idx);
  pTVar4 = luaH_set(L,(Table *)(pTVar3->value_).gc,L->top + -2);
  pTVar1 = L->top;
  pTVar4->value_ = pTVar1[-1].value_;
  uVar2 = *(undefined4 *)&pTVar1[-1].field_0xc;
  pTVar4->tt_ = pTVar1[-1].tt_;
  *(undefined4 *)&pTVar4->field_0xc = uVar2;
  (pTVar3->value_).f[10] = (code)0x0;
  if ((((L->top[-1].tt_ & 0x40U) != 0) && ((((pTVar3->value_).gc)->marked & 4) != 0)) &&
     (((L->top[-1].value_.gc)->marked & 3) != 0)) {
    luaC_barrierback_(L,(Table *)(pTVar3->value_).gc);
  }
  L->top = L->top + -2;
  return;
}

Assistant:

LUA_API void lua_rawset (lua_State *L, int idx) {
  StkId o;
  TValue *slot;
  lua_lock(L);
  api_checknelems(L, 2);
  o = index2addr(L, idx);
  api_check(L, ttistable(o), "table expected");
  slot = luaH_set(L, hvalue(o), L->top - 2);
  setobj2t(L, slot, L->top - 1);
  invalidateTMcache(hvalue(o));
  luaC_barrierback(L, hvalue(o), L->top-1);
  L->top -= 2;
  lua_unlock(L);
}